

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

bool Fixpp::
     tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
               (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                *message,UnderlyingType *value)

{
  ulong uVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = (message->
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          ).allBits.super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 1) != 0) {
    lVar2 = (long)(message->
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                  ).values.base.
                  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>
                  .value.m_view.first;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,lVar2,
               (message->
               super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
               ).values.base.
               super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>
               .value.m_view.second + lVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (value,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)((byte)uVar1 & 1);
}

Assistant:

bool 
    tryGet(const Message& message, typename Tag::Type::UnderlyingType& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            return false;

        value = meta::get<Index::Value>(message.values).get();
        return true;
    }